

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<9,_0,_9,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  float *pfVar1;
  undefined8 *puVar2;
  undefined4 *puVar3;
  int row;
  long lVar4;
  long lVar5;
  Vector<float,_3> res_3;
  Vector<float,_3> res_1;
  Vector<float,_3> res_4;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  float local_d8 [4];
  float local_c8 [4];
  float local_b8 [4];
  float local_a8 [2];
  undefined8 local_a0;
  undefined4 local_98;
  Matrix<float,_3,_3> local_90;
  float local_68 [12];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_18;
  
  pfVar1 = local_68;
  local_68[4] = 0.0;
  local_68[5] = 0.0;
  local_68[6] = 0.0;
  local_68[7] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  local_68[8] = 0.0;
  puVar3 = &s_constInMat3;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)pfVar1 + lVar5) = *(undefined4 *)((long)puVar3 + lVar5);
      lVar5 = lVar5 + 0xc;
    } while (lVar5 != 0x24);
    lVar4 = lVar4 + 1;
    pfVar1 = pfVar1 + 1;
    puVar3 = puVar3 + 1;
  } while (lVar4 != 3);
  local_90.m_data.m_data[0].m_data[2] = 0.0;
  local_90.m_data.m_data[0].m_data[0] = 0.0;
  local_90.m_data.m_data[0].m_data[1] = 0.0;
  lVar4 = 0;
  do {
    local_90.m_data.m_data[0].m_data[lVar4] = local_68[lVar4] + local_68[lVar4 + 3];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_c8[2] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  lVar4 = 0;
  do {
    local_c8[lVar4] = local_90.m_data.m_data[0].m_data[lVar4] + local_68[lVar4 + 6];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  puVar2 = &local_38;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_18 = 0;
  puVar3 = &s_constInMat3;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)puVar2 + lVar5) = *(undefined4 *)((long)puVar3 + lVar5);
      lVar5 = lVar5 + 0xc;
    } while (lVar5 != 0x24);
    lVar4 = lVar4 + 1;
    puVar2 = (undefined8 *)((long)puVar2 + 4);
    puVar3 = puVar3 + 1;
  } while (lVar4 != 3);
  increment<float,3,3>(&local_90,(MatrixCaseUtils *)&local_38,(Matrix<float,_3,_3> *)0x3);
  local_a0 = (ulong)local_a0._4_4_ << 0x20;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  lVar4 = 0;
  do {
    local_a8[lVar4] =
         local_90.m_data.m_data[0].m_data[lVar4] + local_90.m_data.m_data[1].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_d8[2] = 0.0;
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  lVar4 = 0;
  do {
    local_d8[lVar4] = local_a8[lVar4] + local_90.m_data.m_data[2].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[2] = 0.0;
  lVar4 = 0;
  do {
    local_c8[lVar4 + 4] = local_c8[lVar4] + local_d8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_a0 = 0x100000000;
  local_98 = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[(int)local_a8[lVar4]] = local_c8[lVar4 + 2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0)) + reduceToVec3(increment(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}